

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFactoryRegistry.cpp
# Opt level: O0

void __thiscall tcu::FactoryBase::FactoryBase(FactoryBase *this,string *name,string *description)

{
  string *description_local;
  string *name_local;
  FactoryBase *this_local;
  
  AbstractFactory::AbstractFactory(&this->super_AbstractFactory);
  (this->super_AbstractFactory)._vptr_AbstractFactory = (_func_int **)&PTR__FactoryBase_015d0e90;
  std::__cxx11::string::string((string *)&this->m_name,(string *)name);
  std::__cxx11::string::string((string *)&this->m_description,(string *)description);
  return;
}

Assistant:

FactoryBase::FactoryBase (const std::string& name, const std::string& description)
	: m_name		(name)
	, m_description	(description)
{
}